

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWorkerPool.cxx
# Opt level: O2

void __thiscall cmUVReadOnlyProcess::UVPipeOutEnd(cmUVReadOnlyProcess *this,ssize_t error)

{
  bool bVar1;
  string sStack_38;
  
  if (error != 0) {
    bVar1 = cmWorkerPool::ProcessResultT::error((this->Setup_).Result);
    if (!bVar1) {
      std::__cxx11::string::assign((char *)&((this->Setup_).Result)->ErrorMessage);
      std::__cxx11::to_string(&sStack_38,error);
      std::__cxx11::string::append((string *)&((this->Setup_).Result)->ErrorMessage);
      std::__cxx11::string::~string((string *)&sStack_38);
    }
  }
  UVTryFinish(this);
  return;
}

Assistant:

void cmUVReadOnlyProcess::UVPipeOutEnd(ssize_t error)
{
  // Process pipe error
  if ((error != 0) && !Result()->error()) {
    Result()->ErrorMessage =
      "Reading from stdout pipe failed with libuv error code ";
    Result()->ErrorMessage += std::to_string(error);
  }
  // Try finish
  UVTryFinish();
}